

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptFunction.cpp
# Opt level: O0

BOOL __thiscall Js::JavascriptFunction::IsEnumerable(JavascriptFunction *this,PropertyId propertyId)

{
  bool bVar1;
  PropertyIndex PVar2;
  PropertyId propertyId_local;
  JavascriptFunction *this_local;
  
  PVar2 = DynamicObject::GetPropertyIndex(&this->super_DynamicObject,propertyId);
  if (((PVar2 == 0xffff) && ((propertyId | 2U) == 0x1cf)) &&
     (bVar1 = HasRestrictedProperties(this), bVar1)) {
    this_local._4_4_ = 0;
  }
  else {
    this_local._4_4_ = DynamicObject::IsEnumerable(&this->super_DynamicObject,propertyId);
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptFunction::IsEnumerable(PropertyId propertyId)
    {
        if (DynamicObject::GetPropertyIndex(propertyId) == Constants::NoSlot)
        {
            switch (propertyId)
            {
            case PropertyIds::caller:
            case PropertyIds::arguments:
                if (this->HasRestrictedProperties())
                {
                    return false;
                }
                break;
            }
        }
        return DynamicObject::IsEnumerable(propertyId);
    }